

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

bool __thiscall tf::Node::_is_cancelled(Node *this)

{
  long lVar1;
  long in_RDI;
  memory_order __b_1;
  memory_order __b;
  bool local_52;
  
  if ((*(long *)(in_RDI + 0x30) != 0) &&
     (lVar1 = *(long *)(in_RDI + 0x30), std::operator&(memory_order_relaxed,__memory_order_mask),
     (*(uint *)(lVar1 + 0x68) & 0x20000000) != 0)) {
    return true;
  }
  local_52 = false;
  if (*(long *)(in_RDI + 0x38) != 0) {
    lVar1 = *(long *)(in_RDI + 0x38);
    std::operator&(memory_order_relaxed,__memory_order_mask);
    local_52 = (*(uint *)(lVar1 + 4) & 0x20000000) != 0;
  }
  return local_52;
}

Assistant:

inline bool Node::_is_cancelled() const {
  return (_topology && (_topology->_estate.load(std::memory_order_relaxed) & ESTATE::CANCELLED)) 
         ||
         (_parent && (_parent->_estate.load(std::memory_order_relaxed) & ESTATE::CANCELLED));
}